

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.cpp
# Opt level: O2

JointPolicyPureVector * __thiscall
JointPolicyPureVector::operator=(JointPolicyPureVector *this,JointPolicyPureVector *o)

{
  if (this != o) {
    JointPolicyDiscretePure::operator=
              (&this->super_JointPolicyDiscretePure,&o->super_JointPolicyDiscretePure);
    JPolComponent_VectorImplementation::operator=
              (&this->super_JPolComponent_VectorImplementation,
               &o->super_JPolComponent_VectorImplementation);
  }
  return this;
}

Assistant:

JointPolicyPureVector& JointPolicyPureVector::operator= (const JointPolicyPureVector& o)
{
#if DEBUG_JPOLASSIGN 
    cout << "JointPolicyPureVector::operator=(const JointPolicyPureVector& jp) called"<<endl;
#endif
    if (this == &o) return *this;  // Gracefully handle self assignment
    // Put the normal assignment duties here...
    JointPolicyDiscretePure::operator=(o);
    JPolComponent_VectorImplementation::operator=(o);
    return *this;
}